

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O0

int BN_rshift1(BIGNUM *r,BIGNUM *a)

{
  ulong *puVar1;
  ulong *puVar2;
  int iVar3;
  int iVar4;
  BIGNUM *pBVar5;
  ulong uVar6;
  int j;
  int i;
  unsigned_long c;
  unsigned_long t;
  unsigned_long *rp;
  unsigned_long *ap;
  int in_stack_ffffffffffffffbc;
  ulong local_38;
  
  iVar3 = BN_is_zero((BIGNUM *)a);
  if (iVar3 == 0) {
    iVar3 = a->top;
    puVar1 = a->d;
    iVar4 = iVar3 - (uint)(puVar1[iVar3 + -1] == 1);
    if (a != r) {
      pBVar5 = bn_wexpand((BIGNUM *)CONCAT44(iVar3,iVar4),in_stack_ffffffffffffffbc);
      if (pBVar5 == (BIGNUM *)0x0) {
        return 0;
      }
      r->neg = a->neg;
    }
    puVar2 = r->d;
    iVar3 = iVar3 + -1;
    local_38 = 0;
    if ((puVar1[iVar3] & 1) != 0) {
      local_38 = 0x8000000000000000;
    }
    uVar6 = puVar1[iVar3] >> 1;
    if (uVar6 != 0) {
      puVar2[iVar3] = uVar6;
    }
    while (0 < iVar3) {
      iVar3 = iVar3 + -1;
      uVar6 = puVar1[iVar3];
      puVar2[iVar3] = uVar6 >> 1 | local_38;
      local_38 = 0;
      if ((uVar6 & 1) != 0) {
        local_38 = 0x8000000000000000;
      }
    }
    r->top = iVar4;
  }
  else {
    BN_zero_ex((BIGNUM *)r);
  }
  return 1;
}

Assistant:

int BN_rshift1(BIGNUM *r, const BIGNUM *a)
{
    BN_ULONG *ap, *rp, t, c;
    int i, j;

    bn_check_top(r);
    bn_check_top(a);

    if (BN_is_zero(a)) {
        BN_zero(r);
        return (1);
    }
    i = a->top;
    ap = a->d;
    j = i - (ap[i - 1] == 1);
    if (a != r) {
        if (bn_wexpand(r, j) == NULL)
            return (0);
        r->neg = a->neg;
    }
    rp = r->d;
    t = ap[--i];
    c = (t & 1) ? BN_TBIT : 0;
    if (t >>= 1)
        rp[i] = t;
    while (i > 0) {
        t = ap[--i];
        rp[i] = ((t >> 1) & BN_MASK2) | c;
        c = (t & 1) ? BN_TBIT : 0;
    }
    r->top = j;
    bn_check_top(r);
    return (1);
}